

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

GLFWbool parseMapping(_GLFWmapping *mapping,char *string)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  char cVar12;
  undefined4 uVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  char *local_1a8;
  undefined8 uStack_1a0;
  anon_struct_16_2_6ab6935c fields [22];
  
  fields[0].name = "platform";
  fields[0].element = (_GLFWmapelement *)0x0;
  fields[1].name = "a";
  fields[1].element = mapping->buttons;
  fields[2].name = "b";
  fields[2].element = mapping->buttons + 1;
  fields[3].name = "x";
  fields[3].element = mapping->buttons + 2;
  fields[4].name = "y";
  fields[4].element = mapping->buttons + 3;
  fields[5].name = "back";
  fields[5].element = mapping->buttons + 6;
  fields[6].name = "start";
  fields[6].element = mapping->buttons + 7;
  fields[7].name = "guide";
  fields[7].element = mapping->buttons + 8;
  fields[8].name = "leftshoulder";
  fields[8].element = mapping->buttons + 4;
  fields[9].name = "rightshoulder";
  fields[9].element = mapping->buttons + 5;
  fields[10].name = "leftstick";
  fields[10].element = mapping->buttons + 9;
  fields[0xb].name = "rightstick";
  fields[0xb].element = mapping->buttons + 10;
  fields[0xc].name = "dpup";
  fields[0xc].element = mapping->buttons + 0xb;
  fields[0xd].name = "dpright";
  fields[0xd].element = mapping->buttons + 0xc;
  fields[0xe].name = "dpdown";
  fields[0xe].element = mapping->buttons + 0xd;
  fields[0xf].name = "dpleft";
  fields[0xf].element = mapping->buttons + 0xe;
  fields[0x10].name = "lefttrigger";
  fields[0x12].element = mapping->axes;
  fields[0x10].element = mapping->axes + 4;
  fields[0x11].name = "righttrigger";
  fields[0x11].element = mapping->axes + 5;
  fields[0x12].name = "leftx";
  fields[0x13].name = "lefty";
  fields[0x13].element = mapping->axes + 1;
  fields[0x14].name = "rightx";
  fields[0x14].element = mapping->axes + 2;
  fields[0x15].name = "righty";
  fields[0x15].element = mapping->axes + 3;
  local_1a8 = string;
  sVar9 = strcspn(string,",");
  if ((sVar9 == 0x20) && (string[0x20] == ',')) {
    uVar3 = *(undefined8 *)string;
    uVar4 = *(undefined8 *)(string + 8);
    uVar5 = *(undefined8 *)(string + 0x18);
    *(undefined8 *)(mapping->guid + 0x10) = *(undefined8 *)(string + 0x10);
    *(undefined8 *)(mapping->guid + 0x18) = uVar5;
    *(undefined8 *)mapping->guid = uVar3;
    *(undefined8 *)(mapping->guid + 8) = uVar4;
    pcVar15 = string + 0x21;
    sVar9 = strcspn(pcVar15,",");
    if ((sVar9 < 0x80) && (pcVar15[sVar9] == ',')) {
      pcVar1 = mapping->guid;
      memcpy(mapping,pcVar15,sVar9);
      pcVar15 = pcVar15 + sVar9 + 1;
      do {
        cVar6 = *pcVar15;
        local_1a8 = pcVar15;
        if (cVar6 == '\0') {
          for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 1) {
            if ((byte)(pcVar1[lVar16] + 0xbfU) < 6) {
              pcVar1[lVar16] = pcVar1[lVar16] | 0x20;
            }
          }
          (*_glfw.platform.updateGamepadGUID)(pcVar1);
          return 1;
        }
        if (cVar6 == '+') {
          return 0;
        }
        if (cVar6 == '-') {
          return 0;
        }
        for (lVar16 = 8; lVar16 != 0x168; lVar16 = lVar16 + 0x10) {
          pcVar14 = *(char **)((long)&uStack_1a0 + lVar16);
          sVar9 = strlen(pcVar14);
          iVar8 = strncmp(pcVar15,pcVar14,sVar9);
          if ((iVar8 == 0) && (pcVar15[sVar9] == ':')) {
            pcVar14 = pcVar15 + sVar9 + 1;
            pcVar2 = *(char **)((long)&fields[0].name + lVar16);
            if (pcVar2 == (char *)0x0) {
              local_1a8 = pcVar14;
              pcVar15 = (*_glfw.platform.getMappingName)();
              sVar9 = strlen(pcVar15);
              iVar8 = strncmp(pcVar14,pcVar15,sVar9);
              pcVar15 = pcVar14;
              if (iVar8 != 0) {
                return 0;
              }
              break;
            }
            cVar6 = *pcVar14;
            if (cVar6 == '+') {
              uVar13 = 0;
              cVar12 = '\x01';
LAB_001334df:
              pcVar14 = pcVar15 + sVar9 + 2;
              cVar6 = pcVar15[sVar9 + 2];
            }
            else {
              uVar13 = 0xffffffff;
              cVar12 = '\x01';
              if (cVar6 == '-') {
                cVar12 = '\0';
                goto LAB_001334df;
              }
            }
            local_1a8 = pcVar14;
            if (cVar6 == 'a') {
              cVar6 = '\x01';
LAB_00133555:
              *pcVar2 = cVar6;
              uStack_1a0._4_4_ = uVar13;
              uVar11 = strtoul(pcVar14 + 1,&local_1a8,10);
              bVar7 = (byte)uVar11;
            }
            else {
              if (cVar6 != 'h') {
                pcVar15 = pcVar14;
                if (cVar6 == 'b') {
                  cVar6 = '\x02';
                  goto LAB_00133555;
                }
                break;
              }
              *pcVar2 = '\x03';
              uStack_1a0._4_4_ = uVar13;
              uVar11 = strtoul(pcVar14 + 1,&local_1a8,10);
              uVar10 = strtoul(local_1a8 + 1,&local_1a8,10);
              bVar7 = (byte)(uVar11 << 4) | (byte)uVar10;
            }
            pcVar2[1] = bVar7;
            pcVar15 = local_1a8;
            if (*pcVar2 == '\x01') {
              bVar7 = 2 / (byte)(cVar12 - (char)uStack_1a0._4_4_);
              pcVar2[2] = bVar7;
              cVar12 = cVar12 + (char)uStack_1a0._4_4_;
              pcVar2[3] = -cVar12;
              if (*local_1a8 == '~') {
                pcVar2[2] = -bVar7;
                pcVar2[3] = cVar12;
              }
            }
            break;
          }
        }
        sVar9 = strcspn(pcVar15,",");
        pcVar15 = pcVar15 + sVar9;
        local_1a8 = pcVar15;
        sVar9 = strspn(pcVar15,",");
        pcVar15 = pcVar15 + sVar9;
      } while( true );
    }
  }
  _glfwInputError(0x10004,(char *)0x0);
  return 0;
}

Assistant:

static GLFWbool parseMapping(_GLFWmapping* mapping, const char* string)
{
    const char* c = string;
    size_t i, length;
    struct
    {
        const char* name;
        _GLFWmapelement* element;
    } fields[] =
    {
        { "platform",      NULL },
        { "a",             mapping->buttons + GLFW_GAMEPAD_BUTTON_A },
        { "b",             mapping->buttons + GLFW_GAMEPAD_BUTTON_B },
        { "x",             mapping->buttons + GLFW_GAMEPAD_BUTTON_X },
        { "y",             mapping->buttons + GLFW_GAMEPAD_BUTTON_Y },
        { "back",          mapping->buttons + GLFW_GAMEPAD_BUTTON_BACK },
        { "start",         mapping->buttons + GLFW_GAMEPAD_BUTTON_START },
        { "guide",         mapping->buttons + GLFW_GAMEPAD_BUTTON_GUIDE },
        { "leftshoulder",  mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_BUMPER },
        { "rightshoulder", mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_BUMPER },
        { "leftstick",     mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_THUMB },
        { "rightstick",    mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_THUMB },
        { "dpup",          mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_UP },
        { "dpright",       mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_RIGHT },
        { "dpdown",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_DOWN },
        { "dpleft",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_LEFT },
        { "lefttrigger",   mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_TRIGGER },
        { "righttrigger",  mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_TRIGGER },
        { "leftx",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_X },
        { "lefty",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_Y },
        { "rightx",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_X },
        { "righty",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_Y }
    };

    length = strcspn(c, ",");
    if (length != 32 || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->guid, c, length);
    c += length + 1;

    length = strcspn(c, ",");
    if (length >= sizeof(mapping->name) || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->name, c, length);
    c += length + 1;

    while (*c)
    {
        // TODO: Implement output modifiers
        if (*c == '+' || *c == '-')
            return GLFW_FALSE;

        for (i = 0;  i < sizeof(fields) / sizeof(fields[0]);  i++)
        {
            length = strlen(fields[i].name);
            if (strncmp(c, fields[i].name, length) != 0 || c[length] != ':')
                continue;

            c += length + 1;

            if (fields[i].element)
            {
                _GLFWmapelement* e = fields[i].element;
                int8_t minimum = -1;
                int8_t maximum = 1;

                if (*c == '+')
                {
                    minimum = 0;
                    c += 1;
                }
                else if (*c == '-')
                {
                    maximum = 0;
                    c += 1;
                }

                if (*c == 'a')
                    e->type = _GLFW_JOYSTICK_AXIS;
                else if (*c == 'b')
                    e->type = _GLFW_JOYSTICK_BUTTON;
                else if (*c == 'h')
                    e->type = _GLFW_JOYSTICK_HATBIT;
                else
                    break;

                if (e->type == _GLFW_JOYSTICK_HATBIT)
                {
                    const unsigned long hat = strtoul(c + 1, (char**) &c, 10);
                    const unsigned long bit = strtoul(c + 1, (char**) &c, 10);
                    e->index = (uint8_t) ((hat << 4) | bit);
                }
                else
                    e->index = (uint8_t) strtoul(c + 1, (char**) &c, 10);

                if (e->type == _GLFW_JOYSTICK_AXIS)
                {
                    e->axisScale = 2 / (maximum - minimum);
                    e->axisOffset = -(maximum + minimum);

                    if (*c == '~')
                    {
                        e->axisScale = -e->axisScale;
                        e->axisOffset = -e->axisOffset;
                    }
                }
            }
            else
            {
                const char* name = _glfw.platform.getMappingName();
                length = strlen(name);
                if (strncmp(c, name, length) != 0)
                    return GLFW_FALSE;
            }

            break;
        }

        c += strcspn(c, ",");
        c += strspn(c, ",");
    }

    for (i = 0;  i < 32;  i++)
    {
        if (mapping->guid[i] >= 'A' && mapping->guid[i] <= 'F')
            mapping->guid[i] += 'a' - 'A';
    }

    _glfw.platform.updateGamepadGUID(mapping->guid);
    return GLFW_TRUE;
}